

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_sample.hpp
# Opt level: O2

ReservoirSample * __thiscall
duckdb::BlockingSample::Cast<duckdb::ReservoirSample>(BlockingSample *this)

{
  InternalException *this_00;
  allocator local_39;
  string local_38;
  
  if (this->type == RESERVOIR_SAMPLE) {
    return (ReservoirSample *)this;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Failed to cast sample to type - sample type mismatch",&local_39);
  InternalException::InternalException(this_00,&local_38);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

TARGET &Cast() {
		if (type != TARGET::TYPE && TARGET::TYPE != SampleType::BLOCKING_SAMPLE) {
			throw InternalException("Failed to cast sample to type - sample type mismatch");
		}
		return reinterpret_cast<TARGET &>(*this);
	}